

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CollapseDatabaseArray(sqlite3 *db)

{
  u8 uVar1;
  undefined6 uVar2;
  Db *pDVar3;
  Db *pDVar4;
  Db *pDb;
  int j;
  int i;
  sqlite3 *db_local;
  
  pDb._0_4_ = 2;
  for (pDb._4_4_ = 2; pDb._4_4_ < db->nDb; pDb._4_4_ = pDb._4_4_ + 1) {
    pDVar3 = db->aDb + pDb._4_4_;
    if (pDVar3->pBt == (Btree *)0x0) {
      sqlite3DbFree(db,pDVar3->zDbSName);
      pDVar3->zDbSName = (char *)0x0;
    }
    else {
      if ((int)pDb < pDb._4_4_) {
        pDVar3 = db->aDb + (int)pDb;
        pDVar4 = db->aDb + pDb._4_4_;
        pDVar3->zDbSName = pDVar4->zDbSName;
        pDVar3->pBt = pDVar4->pBt;
        uVar1 = pDVar4->bSyncSet;
        uVar2 = *(undefined6 *)&pDVar4->field_0x12;
        pDVar3->safety_level = pDVar4->safety_level;
        pDVar3->bSyncSet = uVar1;
        *(undefined6 *)&pDVar3->field_0x12 = uVar2;
        pDVar3->pSchema = pDVar4->pSchema;
      }
      pDb._0_4_ = (int)pDb + 1;
    }
  }
  db->nDb = (int)pDb;
  if ((db->nDb < 3) && (db->aDb != db->aDbStatic)) {
    memcpy(db->aDbStatic,db->aDb,0x40);
    sqlite3DbFree(db,db->aDb);
    db->aDb = db->aDbStatic;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CollapseDatabaseArray(sqlite3 *db){
  int i, j;
  for(i=j=2; i<db->nDb; i++){
    struct Db *pDb = &db->aDb[i];
    if( pDb->pBt==0 ){
      sqlite3DbFree(db, pDb->zDbSName);
      pDb->zDbSName = 0;
      continue;
    }
    if( j<i ){
      db->aDb[j] = db->aDb[i];
    }
    j++;
  }
  db->nDb = j;
  if( db->nDb<=2 && db->aDb!=db->aDbStatic ){
    memcpy(db->aDbStatic, db->aDb, 2*sizeof(db->aDb[0]));
    sqlite3DbFree(db, db->aDb);
    db->aDb = db->aDbStatic;
  }
}